

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::deinit
          (TextureCubeMapArrayGenerateMipMapFilterable *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  pointer pSVar4;
  uint uVar5;
  ulong uVar6;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  uVar5 = 0;
  (**(code **)(lVar2 + 0x78))(0x8ca8,0);
  (**(code **)(lVar2 + 0xb8))(0x9009,0);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  pSVar4 = (this->m_storage_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    uVar6 = (ulong)uVar5;
    lVar3 = (long)(this->m_storage_configs).
                  super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar4;
    if ((ulong)(lVar3 / 0x14) <= uVar6) break;
    if (pSVar4[uVar6].m_to_id != 0) {
      (**(code **)(lVar2 + 0x480))(1,&pSVar4[uVar6].m_to_id,lVar3 % 0x14);
      pSVar4 = (this->m_storage_configs).
               super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar4[uVar6].m_to_id = 0;
    }
    uVar5 = uVar5 + 1;
  }
  if (this->m_reference_data_ptr != (uchar *)0x0) {
    operator_delete__(this->m_reference_data_ptr);
    this->m_reference_data_ptr = (uchar *)0x0;
  }
  if (this->m_rendered_data_ptr != (uchar *)0x0) {
    operator_delete__(this->m_rendered_data_ptr);
    this->m_rendered_data_ptr = (uchar *)0x0;
  }
  (**(code **)(lVar2 + 0xff0))(0xd05,4);
  (**(code **)(lVar2 + 0xff0))(0xcf5,4);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset texture and FBO bindings */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

	/* Release any ES objects that may have been created. */
	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	for (unsigned int i = 0; i < m_storage_configs.size(); ++i)
	{
		if (m_storage_configs[i].m_to_id != 0)
		{
			gl.deleteTextures(1, &m_storage_configs[i].m_to_id);

			m_storage_configs[i].m_to_id = 0;
		}
	}

	/* Release buffers the test may have allocated */
	if (m_reference_data_ptr != DE_NULL)
	{
		delete[] m_reference_data_ptr;

		m_reference_data_ptr = DE_NULL;
	}

	if (m_rendered_data_ptr != DE_NULL)
	{
		delete[] m_rendered_data_ptr;

		m_rendered_data_ptr = DE_NULL;
	}

	/* Restore pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 4);

	/* Call base class' deinitialization routine. */
	TestCaseBase::deinit();
}